

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_auto_unref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      iVar1 = uv_is_closing((uv_handle_t *)&process);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          iVar1 = uv_is_closing((uv_handle_t *)&process);
          if (iVar1 == 1) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0x618;
          }
          else {
            pcVar4 = "1 == uv_is_closing((uv_handle_t*) &process)";
            uVar3 = 0x617;
          }
        }
        else {
          pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar3 = 0x616;
        }
      }
      else {
        pcVar4 = "0 == uv_is_closing((uv_handle_t*) &process)";
        uVar3 = 0x614;
      }
    }
    else {
      pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
      uVar3 = 0x613;
    }
  }
  else {
    pcVar4 = "0 == uv_spawn(uv_default_loop(), &process, &options)";
    uVar3 = 0x612;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_auto_unref) {
  init_process_options("spawn_helper1", NULL);
  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &process));
  MAKE_VALGRIND_HAPPY();
  return 0;
}